

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

int Gia_RsbFindNodeToRemove(Gia_RsbMan_t *p,int *pMinCost)

{
  int iVar1;
  int iVar2;
  int CostMin;
  int iVar3;
  int i;
  int i_00;
  
  iVar3 = 1000000000;
  iVar2 = -1;
  for (i_00 = 0; i_00 < p->vObjs->nSize; i_00 = i_00 + 1) {
    Vec_IntEntry(p->vObjs,i_00);
    iVar1 = Gia_RsbRemovalCost(p,i_00);
    if (iVar1 < iVar3) {
      iVar2 = i_00;
    }
    if (iVar1 <= iVar3) {
      iVar3 = iVar1;
    }
  }
  if (pMinCost != (int *)0x0) {
    *pMinCost = iVar3;
  }
  return iVar2;
}

Assistant:

int Gia_RsbFindNodeToRemove( Gia_RsbMan_t * p, int * pMinCost )
{
    int i, iObj, iMin = -1, CostMin = ABC_INFINITY;
    Vec_IntForEachEntry( p->vObjs, iObj, i )
    {
        int Cost = Gia_RsbRemovalCost( p, i );
        if ( CostMin > Cost )
        {
            CostMin = Cost;
            iMin = i;
        }
    }
    if ( pMinCost )
        *pMinCost = CostMin;
    return iMin;
}